

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  int iVar3;
  __pid_t _Var4;
  int *piVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar8;
  stringstream *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  long local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  int local_80;
  int local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_54;
  string local_50;
  
  GTestLog::GTestLog((GTestLog *)&local_120,GTEST_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]bvh3/lib/gtest/src/gtest-death-test.cc"
                     ,0x339);
  Message::Message((Message *)&local_c0);
  ss.ptr_ = local_c0.ptr_;
  poVar1 = (ostream *)(local_c0.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," in a threaded context. For this test, ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"couldn\'t detect the number of threads.",0x26);
  StringStreamToString(&local_100,ss.ptr_);
  if (ss.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)ss.ptr_ + 8))(ss.ptr_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_100._M_dataplus._M_p,local_100._M_string_length);
  paVar2 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_120);
  iVar3 = pipe(&local_80);
  if (iVar3 == -1) {
    paVar16 = &local_68;
    local_78 = paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar14 = &local_d0;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_e0 == paVar15) {
      local_d0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0._8_8_ = puVar7[3];
      local_e0 = paVar14;
    }
    else {
      local_d0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_d8 = puVar7[1];
    *puVar7 = paVar15;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    paVar15 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_140 == paVar10) {
      local_130._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_130._8_8_ = puVar7[3];
      local_140 = paVar15;
    }
    else {
      local_130._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_138 = puVar7[1];
    *puVar7 = paVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x33d;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar13 = 0xf;
    if (local_140 != paVar15) {
      uVar13 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_a0._M_string_length + local_138) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar13 = local_a0.field_2._M_allocated_capacity;
      }
      paVar10 = local_140;
      if (local_a0._M_string_length + local_138 <= (ulong)uVar13) goto LAB_0013aa01;
    }
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
LAB_0013aa12:
    local_120 = (long *)*puVar7;
    plVar6 = puVar7 + 2;
    if (local_120 == plVar6) {
      local_110 = *plVar6;
      lStack_108 = puVar7[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar6;
    }
    local_118 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (plVar6 + 2);
    if (local_c0.ptr_ == pbVar11) {
      local_b0 = *(long *)pbVar11;
      lStack_a8 = plVar6[3];
      local_c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
    }
    else {
      local_b0 = *(long *)pbVar11;
    }
    local_b8 = plVar6[1];
    *plVar6 = (long)pbVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*plVar6;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_100._M_dataplus._M_p == psVar12) {
      local_100.field_2._M_allocated_capacity = *psVar12;
      local_100.field_2._8_8_ = plVar6[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar12;
    }
    local_100._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_100);
    puVar7 = extraout_RAX_00;
    local_100._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var4 = fork();
    if (_Var4 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var4;
      if (_Var4 == 0) {
        do {
          iVar3 = close(local_80);
          if (iVar3 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar7;
        psVar12 = puVar7 + 2;
        if (local_78 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_68._M_allocated_capacity = *psVar12;
          local_68._8_8_ = puVar7[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = *psVar12;
        }
        local_70 = puVar7[1];
        *puVar7 = psVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar7;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if (local_e0 == paVar14) {
          local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_d0._8_8_ = puVar7[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_d8 = puVar7[1];
        *puVar7 = paVar14;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_54 = 0x34e;
        StreamableToString<int>(&local_50,&local_54);
        uVar13 = 0xf;
        if (local_e0 != &local_d0) {
          uVar13 = local_d0._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_50._M_string_length + local_d8) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar13 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_50._M_string_length + local_d8) goto LAB_0013a4e1;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0013a4e1:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if (local_140 == paVar14) {
          local_130._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_130._8_8_ = puVar7[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_138 = puVar7[1];
        *puVar7 = paVar14;
        puVar7[1] = 0;
        paVar14->_M_local_buf[0] = '\0';
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*puVar7;
        plVar6 = puVar7 + 2;
        if (local_120 == plVar6) {
          local_110 = *plVar6;
          lStack_108 = puVar7[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar6;
        }
        local_118 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
        psVar9 = (stringstream *)(puVar7 + 2);
        if (local_c0.ptr_ == psVar9) {
          local_b0 = *(long *)psVar9;
          lStack_a8 = puVar7[3];
          local_c0.ptr_ = (stringstream *)&local_b0;
        }
        else {
          local_b0 = *(long *)psVar9;
        }
        local_b8 = puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_100._M_dataplus._M_p = (pointer)*puVar7;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar10) goto LAB_0013a9d3;
        local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_100.field_2._8_8_ = puVar7[3];
        local_100._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        do {
          iVar3 = close(local_7c);
          if (iVar3 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
        psVar12 = (size_type *)(plVar6 + 2);
        if (local_78 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_68._M_allocated_capacity = *psVar12;
          local_68._8_8_ = plVar6[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = *psVar12;
        }
        local_70 = plVar6[1];
        *plVar6 = (long)psVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar6 + 2);
        if (local_e0 == paVar14) {
          local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_d0._8_8_ = plVar6[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_d8 = plVar6[1];
        *plVar6 = (long)paVar14;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_54 = 0x35a;
        StreamableToString<int>(&local_50,&local_54);
        uVar13 = 0xf;
        if (local_e0 != &local_d0) {
          uVar13 = local_d0._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_50._M_string_length + local_d8) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar13 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_50._M_string_length + local_d8) goto LAB_0013a373;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0013a373:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if (local_140 == paVar14) {
          local_130._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_130._8_8_ = puVar7[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_138 = puVar7[1];
        *puVar7 = paVar14;
        puVar7[1] = 0;
        paVar14->_M_local_buf[0] = '\0';
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*plVar6;
        plVar8 = plVar6 + 2;
        if (local_120 == plVar8) {
          local_110 = *plVar8;
          lStack_108 = plVar6[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar8;
        }
        local_118 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
        psVar9 = (stringstream *)(plVar6 + 2);
        if (local_c0.ptr_ == psVar9) {
          local_b0 = *(long *)psVar9;
          lStack_a8 = plVar6[3];
          local_c0.ptr_ = (stringstream *)&local_b0;
        }
        else {
          local_b0 = *(long *)psVar9;
        }
        local_b8 = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_100._M_dataplus._M_p = (pointer)*puVar7;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar10) {
          local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_100.field_2._8_8_ = puVar7[3];
          local_100._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_100._M_string_length = puVar7[1];
        *puVar7 = paVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        DeathTestAbort(&local_100);
        puVar7 = extraout_RAX;
        local_100._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0013a9d3:
        local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      paVar16 = &local_a0.field_2;
      paVar15 = &local_d0;
      paVar14 = &local_68;
      local_100._M_string_length = puVar7[1];
      *puVar7 = paVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      DeathTestAbort(&local_100);
LAB_0013aa01:
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)paVar10);
      goto LAB_0013aa12;
    }
    paVar16 = &local_68;
    local_78 = paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar14 = &local_d0;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_e0 == paVar15) {
      local_d0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0._8_8_ = puVar7[3];
      local_e0 = paVar14;
    }
    else {
      local_d0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_d8 = puVar7[1];
    *puVar7 = paVar15;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    paVar15 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_140 == paVar10) {
      local_130._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_130._8_8_ = puVar7[3];
      local_140 = paVar15;
    }
    else {
      local_130._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_138 = puVar7[1];
    *puVar7 = paVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x34b;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar13 = 0xf;
    if (local_140 != paVar15) {
      uVar13 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_a0._M_string_length + local_138) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar13 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_a0._M_string_length + local_138) goto LAB_0013a93b;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_140);
    }
    else {
LAB_0013a93b:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
    }
    local_120 = (long *)*puVar7;
    plVar6 = puVar7 + 2;
    if (local_120 == plVar6) {
      local_110 = *plVar6;
      lStack_108 = puVar7[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar6;
    }
    local_118 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar7 + 2);
    if (local_c0.ptr_ == pbVar11) {
      local_b0 = *(long *)pbVar11;
      lStack_a8 = puVar7[3];
      local_c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
    }
    else {
      local_b0 = *(long *)pbVar11;
    }
    local_b8 = puVar7[1];
    *puVar7 = pbVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*puVar7;
    psVar12 = puVar7 + 2;
    if ((size_type *)local_100._M_dataplus._M_p == psVar12) {
      local_100.field_2._M_allocated_capacity = *psVar12;
      local_100.field_2._8_8_ = puVar7[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
      goto LAB_0013ac13;
    }
  }
  local_100.field_2._M_allocated_capacity = *psVar12;
LAB_0013ac13:
  local_100._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_c0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0) {
    operator_delete(local_c0.ptr_);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_140 != paVar15) {
    operator_delete(local_140);
  }
  if (local_e0 != paVar14) {
    operator_delete(local_e0);
  }
  if (local_78 != paVar16) {
    operator_delete(local_78);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}